

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_test.cc
# Opt level: O0

void __thiscall leveldb::_Test_Randomized::_Run(_Test_Randomized *this)

{
  int iVar1;
  uint32_t uVar2;
  Slice local_90 [3];
  test local_60 [32];
  string local_40 [8];
  string v;
  int local_20;
  uint local_1c;
  int e;
  int num_entries;
  Random rnd;
  int i;
  _Test_Randomized *this_local;
  
  _rnd = this;
  for (num_entries = 0; num_entries < 0x10; num_entries = num_entries + 1) {
    Harness::Init(&this->super_Harness,(TestArgs *)(kTestArgList + (long)num_entries * 0xc));
    iVar1 = test::RandomSeed();
    Random::Random((Random *)&e,iVar1 + 5);
    for (local_1c = 0; (int)local_1c < 2000; local_1c = iVar1 + local_1c) {
      if ((int)local_1c % 10 == 0) {
        fprintf(_stderr,"case %d of %d: num_entries = %d\n",(ulong)(num_entries + 1),0x10,
                (ulong)local_1c);
      }
      for (local_20 = 0; local_20 < (int)local_1c; local_20 = local_20 + 1) {
        std::__cxx11::string::string(local_40);
        uVar2 = Random::Skewed((Random *)&e,4);
        test::RandomKey_abi_cxx11_(local_60,(Random *)&e,uVar2);
        uVar2 = Random::Skewed((Random *)&e,5);
        test::RandomString((Random *)&e,uVar2,(string *)local_40);
        Slice::ToString_abi_cxx11_(local_90);
        Harness::Add(&this->super_Harness,(string *)local_60,(string *)local_90);
        std::__cxx11::string::~string((string *)local_90);
        std::__cxx11::string::~string((string *)local_60);
        std::__cxx11::string::~string(local_40);
      }
      Harness::Test(&this->super_Harness,(Random *)&e);
      iVar1 = 200;
      if ((int)local_1c < 0x32) {
        iVar1 = 1;
      }
    }
  }
  return;
}

Assistant:

TEST(Harness, Randomized) {
  for (int i = 0; i < kNumTestArgs; i++) {
    Init(kTestArgList[i]);
    Random rnd(test::RandomSeed() + 5);
    for (int num_entries = 0; num_entries < 2000;
         num_entries += (num_entries < 50 ? 1 : 200)) {
      if ((num_entries % 10) == 0) {
        fprintf(stderr, "case %d of %d: num_entries = %d\n", (i + 1),
                int(kNumTestArgs), num_entries);
      }
      for (int e = 0; e < num_entries; e++) {
        std::string v;
        Add(test::RandomKey(&rnd, rnd.Skewed(4)),
            test::RandomString(&rnd, rnd.Skewed(5), &v).ToString());
      }
      Test(&rnd);
    }
  }
}